

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOStreamBuffer.h
# Opt level: O1

bool __thiscall
Assimp::IOStreamBuffer<char>::getNextLine
          (IOStreamBuffer<char> *this,vector<char,_std::allocator<char>_> *buffer)

{
  char cVar1;
  byte bVar2;
  pointer pcVar3;
  size_t sVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar6;
  undefined4 extraout_var_01;
  bool bVar7;
  long lVar8;
  
  std::vector<char,_std::allocator<char>_>::resize(buffer,this->m_cacheSize);
  if (this->m_filePos == 0 || this->m_cachePos == this->m_cacheSize) {
    (*this->m_stream->_vptr_IOStream[4])(this->m_stream,this->m_filePos,0);
    iVar5 = (*this->m_stream->_vptr_IOStream[2])
                      (this->m_stream,
                       (this->m_cache).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,1,this->m_cacheSize);
    uVar6 = CONCAT44(extraout_var,iVar5);
    if (uVar6 == 0) {
      return false;
    }
    if (uVar6 < this->m_cacheSize) {
      this->m_cacheSize = uVar6;
    }
    this->m_filePos = this->m_filePos + this->m_cacheSize;
    this->m_blockIdx = this->m_blockIdx + 1;
    this->m_cachePos = 0;
    if (uVar6 != 0) goto LAB_004cd8d2;
LAB_004cda12:
    bVar7 = false;
  }
  else {
LAB_004cd8d2:
    pcVar3 = (this->m_cache).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (((byte)pcVar3[this->m_cachePos] < 0xe) &&
       ((0x3401U >> ((byte)pcVar3[this->m_cachePos] & 0x1f) & 1) != 0)) {
      cVar1 = pcVar3[this->m_cachePos];
      sVar4 = this->m_cachePos;
      while (cVar1 != '\n') {
        this->m_cachePos = sVar4 + 1;
        cVar1 = pcVar3[sVar4 + 1];
        sVar4 = sVar4 + 1;
      }
      this->m_cachePos = sVar4 + 1;
      if (sVar4 + 1 == this->m_cacheSize) {
        (*this->m_stream->_vptr_IOStream[4])(this->m_stream,this->m_filePos,0);
        iVar5 = (*this->m_stream->_vptr_IOStream[2])
                          (this->m_stream,
                           (this->m_cache).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start,1,this->m_cacheSize);
        uVar6 = CONCAT44(extraout_var_00,iVar5);
        if (uVar6 == 0) {
          return false;
        }
        if (uVar6 < this->m_cacheSize) {
          this->m_cacheSize = uVar6;
        }
        this->m_filePos = this->m_filePos + this->m_cacheSize;
        this->m_blockIdx = this->m_blockIdx + 1;
        this->m_cachePos = 0;
        if (uVar6 == 0) goto LAB_004cda12;
      }
    }
    lVar8 = 0;
    while( true ) {
      bVar2 = (this->m_cache).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start[this->m_cachePos];
      pcVar3 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      bVar7 = (bool)((byte)(0x3401 >> (bVar2 & 0x1f)) & bVar2 < 0xe);
      if (bVar7 != false) break;
      pcVar3[lVar8] = bVar2;
      uVar6 = this->m_cachePos + 1;
      this->m_cachePos = uVar6;
      if (this->m_cacheSize <= uVar6) {
        (*this->m_stream->_vptr_IOStream[4])(this->m_stream,this->m_filePos,0);
        iVar5 = (*this->m_stream->_vptr_IOStream[2])
                          (this->m_stream,
                           (this->m_cache).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start,1,this->m_cacheSize);
        uVar6 = CONCAT44(extraout_var_01,iVar5);
        if (uVar6 == 0) {
          return false;
        }
        if (uVar6 < this->m_cacheSize) {
          this->m_cacheSize = uVar6;
        }
        this->m_filePos = this->m_filePos + this->m_cacheSize;
        this->m_blockIdx = this->m_blockIdx + 1;
        this->m_cachePos = 0;
        if (uVar6 == 0) {
          return false;
        }
      }
      lVar8 = lVar8 + 1;
    }
    pcVar3[lVar8] = '\n';
    this->m_cachePos = this->m_cachePos + 1;
  }
  return bVar7;
}

Assistant:

AI_FORCE_INLINE
bool IOStreamBuffer<T>::getNextLine(std::vector<T> &buffer) {
    buffer.resize(m_cacheSize);
    if ( isEndOfCache( m_cachePos, m_cacheSize ) || 0 == m_filePos) {
       if (!readNextBlock()) {
          return false;
       }
      }

    if (IsLineEnd(m_cache[m_cachePos])) {
        // skip line end
        while (m_cache[m_cachePos] != '\n') {
            ++m_cachePos;
        }
        ++m_cachePos;
        if ( isEndOfCache( m_cachePos, m_cacheSize ) ) {
            if ( !readNextBlock() ) {
                return false;
            }
        }
    }

    size_t i( 0 );
    while (!IsLineEnd(m_cache[ m_cachePos ])) {
        buffer[i] = m_cache[ m_cachePos ];
        ++m_cachePos;
        ++i;
        if (m_cachePos >= m_cacheSize) {
            if (!readNextBlock()) {
                return false;
            }
        }
    }
    buffer[i] = '\n';
    ++m_cachePos;

    return true;
}